

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetResMonConstValue(void *kinmem,sunrealtype omegaconst)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x24b,"KINSetResMonConstValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 <= in_XMM0_Qa) {
    in_RDI->kin_omega = in_XMM0_Qa;
    local_4 = 0;
  }
  else {
    KINProcessError(in_RDI,-2,0x255,"KINSetResMonConstValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"scalars < 0 illegal.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetResMonConstValue(void* kinmem, sunrealtype omegaconst)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check omegaconst */

  if (omegaconst < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  /* Load omega value. A value of 0 will force using omega_min and omega_max */
  kin_mem->kin_omega = omegaconst;

  return (KIN_SUCCESS);
}